

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O0

Unique<anurbs::Entry<anurbs::BrepFace>_> __thiscall
anurbs::
new_<anurbs::Entry<anurbs::BrepFace>,std::shared_ptr<anurbs::BrepFace>&,std::shared_ptr<anurbs::Attributes>&>
          (anurbs *this,shared_ptr<anurbs::BrepFace> *args,shared_ptr<anurbs::Attributes> *args_1)

{
  Entry<anurbs::BrepFace> *this_00;
  shared_ptr<anurbs::Attributes> local_40;
  shared_ptr<anurbs::BrepFace> local_30;
  shared_ptr<anurbs::Attributes> *local_20;
  shared_ptr<anurbs::Attributes> *args_local_1;
  shared_ptr<anurbs::BrepFace> *args_local;
  
  local_20 = args_1;
  args_local_1 = (shared_ptr<anurbs::Attributes> *)args;
  args_local = (shared_ptr<anurbs::BrepFace> *)this;
  this_00 = (Entry<anurbs::BrepFace> *)operator_new(0x48);
  std::shared_ptr<anurbs::BrepFace>::shared_ptr
            (&local_30,(shared_ptr<anurbs::BrepFace> *)args_local_1);
  std::shared_ptr<anurbs::Attributes>::shared_ptr(&local_40,local_20);
  Entry<anurbs::BrepFace>::Entry(this_00,&local_30,&local_40);
  std::
  unique_ptr<anurbs::Entry<anurbs::BrepFace>,std::default_delete<anurbs::Entry<anurbs::BrepFace>>>::
  unique_ptr<std::default_delete<anurbs::Entry<anurbs::BrepFace>>,void>
            ((unique_ptr<anurbs::Entry<anurbs::BrepFace>,std::default_delete<anurbs::Entry<anurbs::BrepFace>>>
              *)this,this_00);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr(&local_40);
  std::shared_ptr<anurbs::BrepFace>::~shared_ptr(&local_30);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::BrepFace>,_std::default_delete<anurbs::Entry<anurbs::BrepFace>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::BrepFace>,_std::default_delete<anurbs::Entry<anurbs::BrepFace>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}